

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_n.c
# Opt level: O0

void test_n(void)

{
  wchar_t wVar1;
  int r;
  char *reffile;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
                     ,L'\x0f',"test_basic",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
                      ,L'\x10',"test_basic/a",L'Ƥ',L'\xffffffff',"orig a\n");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
                      ,L'\x11',"test_basic/b",L'Ƥ',L'\xffffffff',"orig b\n");
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s -n %s >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
                      ,L'\x15',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x16',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x17',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x19',"orig a\n","test_basic/a");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x1a',"orig b\n","test_basic/b");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x1b',"contents c\n","test_basic/c");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_n.c"
             ,L'\x1c',"contents CAPS\n","test_basic/CAPS");
  return;
}

Assistant:

DEFINE_TEST(test_n)
{
	const char *reffile = "test_basic.zip";
	int r;

	assertMakeDir("test_basic", 0755);
	assertMakeFile("test_basic/a", 0644, "orig a\n");
	assertMakeFile("test_basic/b", 0644, "orig b\n");

	extract_reference_file(reffile);
	r = systemf("%s -n %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("orig a\n", "test_basic/a");
	assertTextFileContents("orig b\n", "test_basic/b");
	assertTextFileContents("contents c\n", "test_basic/c");
	assertTextFileContents("contents CAPS\n", "test_basic/CAPS");
}